

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O1

int mbedtls_x509_crt_info(char *buf,size_t size,char *prefix,mbedtls_x509_crt *crt)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  char *p;
  size_t n;
  char *local_58;
  ulong local_50;
  char key_size_str [18];
  
  p = buf;
  n = size;
  uVar1 = snprintf(buf,size,"%scert. version     : %d\n",prefix,(ulong)(uint)crt->version);
  iVar4 = -0x2980;
  iVar2 = iVar4;
  if (-1 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
    uVar5 = size - uVar7;
    if (uVar7 <= size && uVar5 != 0) {
      pcVar9 = buf + uVar7;
      p = pcVar9;
      n = uVar5;
      uVar1 = snprintf(pcVar9,uVar5,"%sserial number     : ",prefix);
      if (-1 < (int)uVar1) {
        uVar7 = (ulong)uVar1;
        uVar6 = uVar5 - uVar7;
        if (uVar7 <= uVar5 && uVar6 != 0) {
          pcVar9 = pcVar9 + uVar7;
          p = pcVar9;
          n = uVar6;
          uVar1 = mbedtls_x509_serial_gets(pcVar9,uVar6,&crt->serial);
          if (-1 < (int)uVar1) {
            uVar7 = (ulong)uVar1;
            uVar5 = uVar6 - uVar7;
            if (uVar7 <= uVar6 && uVar5 != 0) {
              pcVar9 = pcVar9 + uVar7;
              p = pcVar9;
              n = uVar5;
              uVar1 = snprintf(pcVar9,uVar5,"\n%sissuer name       : ",prefix);
              if (-1 < (int)uVar1) {
                uVar7 = (ulong)uVar1;
                uVar6 = uVar5 - uVar7;
                if (uVar7 <= uVar5 && uVar6 != 0) {
                  pcVar9 = pcVar9 + uVar7;
                  p = pcVar9;
                  n = uVar6;
                  uVar1 = mbedtls_x509_dn_gets(pcVar9,uVar6,&crt->issuer);
                  if (-1 < (int)uVar1) {
                    uVar7 = (ulong)uVar1;
                    uVar5 = uVar6 - uVar7;
                    if (uVar7 <= uVar6 && uVar5 != 0) {
                      pcVar9 = pcVar9 + uVar7;
                      p = pcVar9;
                      n = uVar5;
                      uVar1 = snprintf(pcVar9,uVar5,"\n%ssubject name      : ",prefix);
                      if (-1 < (int)uVar1) {
                        uVar7 = (ulong)uVar1;
                        uVar6 = uVar5 - uVar7;
                        if (uVar7 <= uVar5 && uVar6 != 0) {
                          pcVar9 = pcVar9 + uVar7;
                          p = pcVar9;
                          n = uVar6;
                          uVar1 = mbedtls_x509_dn_gets(pcVar9,uVar6,&crt->subject);
                          if (-1 < (int)uVar1) {
                            uVar7 = (ulong)uVar1;
                            n = uVar6 - uVar7;
                            if (uVar7 <= uVar6 && n != 0) {
                              p = pcVar9 + uVar7;
                              local_50 = (ulong)(uint)(crt->valid_from).day;
                              local_58 = (char *)(ulong)(uint)(crt->valid_from).hour;
                              uVar1 = snprintf(p,n,
                                               "\n%sissued  on        : %04d-%02d-%02d %02d:%02d:%02d"
                                               ,prefix,(ulong)(uint)(crt->valid_from).year,
                                               (ulong)(uint)(crt->valid_from).mon,local_50,local_58,
                                               (ulong)(uint)(crt->valid_from).min,
                                               (ulong)(uint)(crt->valid_from).sec);
                              if (-1 < (int)uVar1) {
                                uVar5 = (ulong)uVar1;
                                uVar7 = n - uVar5;
                                if (uVar5 <= n && uVar7 != 0) {
                                  p = p + uVar5;
                                  local_50 = (ulong)(uint)(crt->valid_to).day;
                                  n = uVar7;
                                  local_58 = p;
                                  uVar1 = snprintf(p,uVar7,
                                                  "\n%sexpires on        : %04d-%02d-%02d %02d:%02d:%02d"
                                                  ,prefix,(ulong)(uint)(crt->valid_to).year,
                                                  (ulong)(uint)(crt->valid_to).mon,local_50,
                                                  (ulong)(uint)(crt->valid_to).hour,
                                                  (ulong)(uint)(crt->valid_to).min,
                                                  (ulong)(uint)(crt->valid_to).sec);
                                  if (-1 < (int)uVar1) {
                                    uVar5 = (ulong)uVar1;
                                    uVar6 = uVar7 - uVar5;
                                    if (uVar5 <= uVar7 && uVar6 != 0) {
                                      pcVar9 = local_58 + uVar5;
                                      p = pcVar9;
                                      n = uVar6;
                                      uVar1 = snprintf(pcVar9,uVar6,"\n%ssigned using      : ",
                                                       prefix);
                                      if (-1 < (int)uVar1) {
                                        uVar7 = (ulong)uVar1;
                                        uVar5 = uVar6 - uVar7;
                                        if (uVar7 <= uVar6 && uVar5 != 0) {
                                          pcVar9 = pcVar9 + uVar7;
                                          p = pcVar9;
                                          n = uVar5;
                                          uVar1 = mbedtls_x509_sig_alg_gets
                                                            (pcVar9,uVar5,&crt->sig_oid,crt->sig_pk,
                                                             crt->sig_md,crt->sig_opts);
                                          if (-1 < (int)uVar1) {
                                            uVar7 = (ulong)uVar1;
                                            uVar6 = uVar5 - uVar7;
                                            if (uVar7 <= uVar5 && uVar6 != 0) {
                                              p = pcVar9 + uVar7;
                                              n = uVar6;
                                              local_58 = p;
                                              pcVar9 = mbedtls_pk_get_name(&crt->pk);
                                              iVar2 = mbedtls_x509_key_size_helper
                                                                (key_size_str,0x12,pcVar9);
                                              if (iVar2 == 0) {
                                                sVar3 = mbedtls_pk_get_bitlen(&crt->pk);
                                                uVar1 = snprintf(local_58,uVar6,"\n%s%-18s: %d bits"
                                                                 ,prefix,key_size_str,
                                                                 sVar3 & 0xffffffff);
                                                iVar2 = iVar4;
                                                if (-1 < (int)uVar1) {
                                                  uVar7 = (ulong)uVar1;
                                                  uVar5 = uVar6 - uVar7;
                                                  if (uVar7 <= uVar6 && uVar5 != 0) {
                                                    pcVar9 = local_58 + uVar7;
                                                    p = pcVar9;
                                                    n = uVar5;
                                                    if ((crt->ext_types & 0x100) != 0) {
                                                      pcVar8 = "true";
                                                      if (crt->ca_istrue == 0) {
                                                        pcVar8 = "false";
                                                      }
                                                      uVar1 = snprintf(pcVar9,uVar5,
                                                                                                                                              
                                                  "\n%sbasic constraints : CA=%s",prefix,pcVar8);
                                                  if ((int)uVar1 < 0) {
                                                    return -0x2980;
                                                  }
                                                  uVar7 = (ulong)uVar1;
                                                  uVar6 = uVar5 - uVar7;
                                                  if (uVar5 < uVar7 || uVar6 == 0) {
                                                    return -0x2980;
                                                  }
                                                  pcVar9 = pcVar9 + uVar7;
                                                  p = pcVar9;
                                                  n = uVar6;
                                                  if (0 < crt->max_pathlen) {
                                                    uVar1 = snprintf(pcVar9,uVar6,", max_pathlen=%d"
                                                                     ,(ulong)(crt->max_pathlen - 1))
                                                    ;
                                                    if ((int)uVar1 < 0) {
                                                      return -0x2980;
                                                    }
                                                    uVar7 = (ulong)uVar1;
                                                    n = uVar6 - uVar7;
                                                    if (uVar6 < uVar7 || n == 0) {
                                                      return -0x2980;
                                                    }
                                                    p = pcVar9 + uVar7;
                                                  }
                                                  }
                                                  sVar3 = n;
                                                  pcVar9 = p;
                                                  if ((crt->ext_types & 0x20) != 0) {
                                                    uVar1 = snprintf(p,n,"\n%ssubject alt name  : ",
                                                                     prefix);
                                                    if ((int)uVar1 < 0) {
                                                      return -0x2980;
                                                    }
                                                    uVar7 = (ulong)uVar1;
                                                    n = sVar3 - uVar7;
                                                    if (sVar3 < uVar7 || n == 0) {
                                                      return -0x2980;
                                                    }
                                                    p = pcVar9 + uVar7;
                                                    iVar2 = x509_info_subject_alt_name
                                                                      (&p,&n,&crt->subject_alt_names
                                                                      );
                                                    if (iVar2 != 0) {
                                                      return iVar2;
                                                    }
                                                  }
                                                  sVar3 = n;
                                                  pcVar9 = p;
                                                  if ((crt->ext_types & 0x10000) != 0) {
                                                    uVar1 = snprintf(p,n,"\n%scert. type        : ",
                                                                     prefix);
                                                    if ((int)uVar1 < 0) {
                                                      return -0x2980;
                                                    }
                                                    uVar7 = (ulong)uVar1;
                                                    n = sVar3 - uVar7;
                                                    if (sVar3 < uVar7 || n == 0) {
                                                      return -0x2980;
                                                    }
                                                    p = pcVar9 + uVar7;
                                                    iVar2 = x509_info_cert_type(&p,&n,crt->
                                                  ns_cert_type);
                                                  if (iVar2 != 0) {
                                                    return iVar2;
                                                  }
                                                  }
                                                  sVar3 = n;
                                                  pcVar9 = p;
                                                  if ((crt->ext_types & 4) != 0) {
                                                    uVar1 = snprintf(p,n,"\n%skey usage         : ",
                                                                     prefix);
                                                    if ((int)uVar1 < 0) {
                                                      return -0x2980;
                                                    }
                                                    uVar7 = (ulong)uVar1;
                                                    n = sVar3 - uVar7;
                                                    if (sVar3 < uVar7 || n == 0) {
                                                      return -0x2980;
                                                    }
                                                    p = pcVar9 + uVar7;
                                                    iVar2 = x509_info_key_usage(&p,&n,crt->key_usage
                                                                               );
                                                    if (iVar2 != 0) {
                                                      return iVar2;
                                                    }
                                                  }
                                                  sVar3 = n;
                                                  pcVar9 = p;
                                                  if ((crt->ext_types & 0x800) != 0) {
                                                    uVar1 = snprintf(p,n,"\n%sext key usage     : ",
                                                                     prefix);
                                                    if ((int)uVar1 < 0) {
                                                      return -0x2980;
                                                    }
                                                    uVar7 = (ulong)uVar1;
                                                    n = sVar3 - uVar7;
                                                    if (sVar3 < uVar7 || n == 0) {
                                                      return -0x2980;
                                                    }
                                                    p = pcVar9 + uVar7;
                                                    iVar2 = x509_info_ext_key_usage
                                                                      (&p,&n,&crt->ext_key_usage);
                                                    if (iVar2 != 0) {
                                                      return iVar2;
                                                    }
                                                  }
                                                  sVar3 = n;
                                                  uVar1 = snprintf(p,n,anon_var_dwarf_c1107 + 8);
                                                  iVar2 = iVar4;
                                                  if ((-1 < (int)uVar1) &&
                                                     (lVar10 = sVar3 - uVar1,
                                                     uVar1 <= sVar3 && lVar10 != 0)) {
                                                    iVar2 = (int)size - (int)lVar10;
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_x509_crt_info( char *buf, size_t size, const char *prefix,
                   const mbedtls_x509_crt *crt )
{
    int ret;
    size_t n;
    char *p;
    char key_size_str[BEFORE_COLON];

    p = buf;
    n = size;

    ret = mbedtls_snprintf( p, n, "%scert. version     : %d\n",
                               prefix, crt->version );
    MBEDTLS_X509_SAFE_SNPRINTF;
    ret = mbedtls_snprintf( p, n, "%sserial number     : ",
                               prefix );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_x509_serial_gets( p, n, &crt->serial );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf( p, n, "\n%sissuer name       : ", prefix );
    MBEDTLS_X509_SAFE_SNPRINTF;
    ret = mbedtls_x509_dn_gets( p, n, &crt->issuer  );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf( p, n, "\n%ssubject name      : ", prefix );
    MBEDTLS_X509_SAFE_SNPRINTF;
    ret = mbedtls_x509_dn_gets( p, n, &crt->subject );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf( p, n, "\n%sissued  on        : " \
                   "%04d-%02d-%02d %02d:%02d:%02d", prefix,
                   crt->valid_from.year, crt->valid_from.mon,
                   crt->valid_from.day,  crt->valid_from.hour,
                   crt->valid_from.min,  crt->valid_from.sec );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf( p, n, "\n%sexpires on        : " \
                   "%04d-%02d-%02d %02d:%02d:%02d", prefix,
                   crt->valid_to.year, crt->valid_to.mon,
                   crt->valid_to.day,  crt->valid_to.hour,
                   crt->valid_to.min,  crt->valid_to.sec );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf( p, n, "\n%ssigned using      : ", prefix );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_x509_sig_alg_gets( p, n, &crt->sig_oid, crt->sig_pk,
                             crt->sig_md, crt->sig_opts );
    MBEDTLS_X509_SAFE_SNPRINTF;

    /* Key size */
    if( ( ret = mbedtls_x509_key_size_helper( key_size_str, BEFORE_COLON,
                                      mbedtls_pk_get_name( &crt->pk ) ) ) != 0 )
    {
        return( ret );
    }

    ret = mbedtls_snprintf( p, n, "\n%s%-" BC "s: %d bits", prefix, key_size_str,
                          (int) mbedtls_pk_get_bitlen( &crt->pk ) );
    MBEDTLS_X509_SAFE_SNPRINTF;

    /*
     * Optional extensions
     */

    if( crt->ext_types & MBEDTLS_X509_EXT_BASIC_CONSTRAINTS )
    {
        ret = mbedtls_snprintf( p, n, "\n%sbasic constraints : CA=%s", prefix,
                        crt->ca_istrue ? "true" : "false" );
        MBEDTLS_X509_SAFE_SNPRINTF;

        if( crt->max_pathlen > 0 )
        {
            ret = mbedtls_snprintf( p, n, ", max_pathlen=%d", crt->max_pathlen - 1 );
            MBEDTLS_X509_SAFE_SNPRINTF;
        }
    }

    if( crt->ext_types & MBEDTLS_X509_EXT_SUBJECT_ALT_NAME )
    {
        ret = mbedtls_snprintf( p, n, "\n%ssubject alt name  : ", prefix );
        MBEDTLS_X509_SAFE_SNPRINTF;

        if( ( ret = x509_info_subject_alt_name( &p, &n,
                                            &crt->subject_alt_names ) ) != 0 )
            return( ret );
    }

    if( crt->ext_types & MBEDTLS_X509_EXT_NS_CERT_TYPE )
    {
        ret = mbedtls_snprintf( p, n, "\n%scert. type        : ", prefix );
        MBEDTLS_X509_SAFE_SNPRINTF;

        if( ( ret = x509_info_cert_type( &p, &n, crt->ns_cert_type ) ) != 0 )
            return( ret );
    }

    if( crt->ext_types & MBEDTLS_X509_EXT_KEY_USAGE )
    {
        ret = mbedtls_snprintf( p, n, "\n%skey usage         : ", prefix );
        MBEDTLS_X509_SAFE_SNPRINTF;

        if( ( ret = x509_info_key_usage( &p, &n, crt->key_usage ) ) != 0 )
            return( ret );
    }

    if( crt->ext_types & MBEDTLS_X509_EXT_EXTENDED_KEY_USAGE )
    {
        ret = mbedtls_snprintf( p, n, "\n%sext key usage     : ", prefix );
        MBEDTLS_X509_SAFE_SNPRINTF;

        if( ( ret = x509_info_ext_key_usage( &p, &n,
                                             &crt->ext_key_usage ) ) != 0 )
            return( ret );
    }

    ret = mbedtls_snprintf( p, n, "\n" );
    MBEDTLS_X509_SAFE_SNPRINTF;

    return( (int) ( size - n ) );
}